

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int compare_sad(void *a,void *b)

{
  int iVar1;
  int diff;
  void *b_local;
  void *a_local;
  undefined4 local_4;
  
  iVar1 = *(int *)((long)a + 4) - *(int *)((long)b + 4);
  if (iVar1 < 0) {
    local_4 = -1;
  }
  else if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int compare_sad(const void *a, const void *b) {
  const int diff = ((center_mv_t *)a)->sad - ((center_mv_t *)b)->sad;
  if (diff < 0)
    return -1;
  else if (diff > 0)
    return 1;
  return 0;
}